

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.h
# Opt level: O0

ArrayBufferDetachedStateBase * __thiscall
Js::ProjectionArrayBuffer::CreateDetachedState
          (ProjectionArrayBuffer *this,RefCountedBuffer *content,uint32 bufferLength)

{
  uint32 bufferLength_00;
  RefCountedBuffer *buffer;
  HeapAllocator *alloc;
  ArrayBufferDetachedState<void_(*)(void_*)> *this_00;
  ScriptContext *this_01;
  Recycler *r;
  TrackAllocData local_48;
  uint32 local_1c;
  RefCountedBuffer *pRStack_18;
  uint32 bufferLength_local;
  RefCountedBuffer *content_local;
  ProjectionArrayBuffer *this_local;
  
  local_1c = bufferLength;
  pRStack_18 = content;
  content_local = (RefCountedBuffer *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&ArrayBuffer::ArrayBufferDetachedState<void(*)(void*)>::typeinfo
             ,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.h"
             ,0x173);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
  this_00 = (ArrayBufferDetachedState<void_(*)(void_*)> *)
            new<Memory::HeapAllocator>(0x30,alloc,0x350bd0);
  buffer = pRStack_18;
  bufferLength_00 = local_1c;
  this_01 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  r = ScriptContext::GetRecycler(this_01);
  ArrayBuffer::ArrayBufferDetachedState<void_(*)(void_*)>::ArrayBufferDetachedState
            (this_00,buffer,bufferLength_00,CoTaskMemFree,r,CoTask);
  return &this_00->super_ArrayBufferDetachedStateBase;
}

Assistant:

virtual ArrayBufferDetachedStateBase* CreateDetachedState(RefCountedBuffer * content, DECLSPEC_GUARD_OVERFLOW uint32 bufferLength) override
        {
            return HeapNew(ArrayBufferDetachedState<FreeFn>, content, bufferLength, CoTaskMemFree, GetScriptContext()->GetRecycler(), ArrayBufferAllocationType::CoTask);
        }